

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_java_struct_reader(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  ostream *poVar2;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "public void read(org.apache.thrift.protocol.TProtocol iprot) throws org.apache.thrift.TException {"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"scheme(iprot).read(iprot, this);",0x20)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_reader(ostream& out, t_struct* tstruct) {
  (void)tstruct;
  indent(out) << "public void read(org.apache.thrift.protocol.TProtocol iprot) throws "
                 "org.apache.thrift.TException {" << endl;
  indent_up();
  indent(out) << "scheme(iprot).read(iprot, this);" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}